

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O3

REF_STATUS ref_cavity_pass(REF_GRID ref_grid)

{
  int iVar1;
  uint node1;
  REF_INT cell;
  REF_ADJ pRVar2;
  REF_DBL *pRVar3;
  REF_CAVITY pRVar4;
  double dVar5;
  REF_STATUS RVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  undefined8 uVar10;
  REF_GRID pRVar11;
  int iVar12;
  REF_INT RVar13;
  char *pcVar14;
  int *piVar15;
  long lVar16;
  REF_CELL ref_cell;
  REF_CELL pRVar17;
  bool bVar18;
  REF_BOOL allowed;
  REF_CAVITY ref_cavity;
  REF_DBL min_add;
  REF_DBL min_del;
  REF_BOOL has_triangle;
  REF_DBL quality;
  REF_INT degree;
  REF_BOOL improved;
  REF_BOOL conforming;
  REF_BOOL manifold;
  REF_BOOL same_face;
  REF_INT nodes [27];
  uint local_11c;
  REF_GRID local_118;
  REF_CELL local_110;
  undefined8 local_108;
  undefined8 local_100;
  REF_CAVITY local_f8;
  int local_f0;
  int local_ec;
  REF_NODE local_e8;
  double local_e0;
  REF_CELL local_d8;
  long local_d0;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  double local_b0;
  uint local_a8 [30];
  
  local_e8 = ref_grid->node;
  pRVar17 = ref_grid->cell[8];
  local_118 = ref_grid;
  if (0 < pRVar17->max) {
    RVar13 = 0;
    local_110 = pRVar17;
    do {
      piVar15 = &DAT_00207ef8;
      local_d8 = (REF_CELL)CONCAT44(local_d8._4_4_,RVar13);
      RVar6 = ref_cell_nodes(pRVar17,RVar13,(REF_INT *)local_a8);
      if (RVar6 == 0) {
        uVar7 = ref_node_tet_quality(local_e8,(REF_INT *)local_a8,&local_e0);
        if (uVar7 != 0) {
          pcVar14 = "qual";
          uVar10 = 0xa50;
          goto LAB_0016429e;
        }
        if (local_e0 < ref_grid->adapt->swap_min_quality) {
          local_f0 = -1;
          lVar16 = 0;
          local_b0 = -2.0;
          do {
            iVar12 = piVar15[-2];
            iVar1 = piVar15[-1];
            uVar7 = local_a8[iVar12];
            lVar9 = (long)(int)uVar7;
            uVar8 = local_a8[iVar1];
            if ((lVar9 < 0) ||
               (((((pRVar2 = ref_grid->cell[9]->ref_adj, pRVar2->nnode <= (int)uVar7 ||
                   (pRVar2->first[lVar9] == -1)) &&
                  ((pRVar2 = ref_grid->cell[10]->ref_adj, pRVar2->nnode <= (int)uVar7 ||
                   (pRVar2->first[lVar9] == -1)))) &&
                 ((pRVar2 = ref_grid->cell[0xb]->ref_adj, pRVar2->nnode <= (int)uVar7 ||
                  (pRVar2->first[lVar9] == -1)))) &&
                ((pRVar2 = ref_grid->cell[6]->ref_adj, pRVar2->nnode <= (int)uVar7 ||
                 (pRVar2->first[lVar9] == -1)))))) {
              if (-1 < (int)uVar8) {
                pRVar2 = ref_grid->cell[9]->ref_adj;
                if ((((pRVar2->nnode <= (int)uVar8) || (pRVar2->first[uVar8] == -1)) &&
                    ((pRVar2 = ref_grid->cell[10]->ref_adj, pRVar2->nnode <= (int)uVar8 ||
                     (pRVar2->first[uVar8] == -1)))) &&
                   ((pRVar2 = ref_grid->cell[0xb]->ref_adj, pRVar2->nnode <= (int)uVar8 ||
                    (pRVar2->first[uVar8] == -1)))) {
                  pRVar2 = ref_grid->cell[6]->ref_adj;
                  if (pRVar2->nnode <= (int)uVar8) goto LAB_0016345b;
                  bVar18 = pRVar2->first[uVar8] == -1;
                  local_11c = (uint)bVar18;
                  if (bVar18) goto LAB_00163463;
                  goto LAB_00163423;
                }
                goto LAB_0016341b;
              }
LAB_0016345b:
              local_11c = 1;
LAB_00163463:
              local_d0 = (long)*piVar15;
              uVar7 = ref_cell_local_gem(pRVar17,local_e8,uVar7,uVar8,(REF_BOOL *)&local_11c);
              if (uVar7 != 0) {
                pcVar14 = "local gem";
                uVar10 = 0xa5d;
                goto LAB_0016429e;
              }
              if (local_11c != 0) {
                uVar8 = local_a8[iVar12];
                node1 = local_a8[iVar1];
                local_11c = 0;
                uVar7 = ref_cell_has_side(ref_grid->cell[3],uVar8,node1,&local_ec);
                if (uVar7 != 0) {
                  pcVar14 = "triangle side";
                  uVar10 = 0xa12;
LAB_00163fd2:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,uVar10,"ref_cavity_edge_swap_boundary",(ulong)uVar7,pcVar14);
                  pcVar14 = "surface geom and topo";
                  uVar10 = 0xa61;
                  goto LAB_0016429e;
                }
                if (local_ec == 0) {
LAB_00163593:
                  pRVar17 = local_110;
                  local_11c = 1;
                  uVar7 = ref_cell_degree_with2
                                    (local_110,local_a8[iVar12],local_a8[iVar1],&local_c8);
                  ref_grid = local_118;
                  if (uVar7 != 0) {
                    pcVar14 = "edge degree";
                    uVar10 = 0xa64;
                    goto LAB_0016429e;
                  }
                  if (local_c8 <= local_118->adapt->swap_max_degree) {
                    uVar7 = ref_cavity_create((REF_CAVITY *)&local_108);
                    if (uVar7 != 0) {
                      pcVar14 = "create";
                      uVar10 = 0xa66;
                      goto LAB_0016429e;
                    }
                    pRVar4 = (REF_CAVITY)CONCAT44(local_108._4_4_,(int)local_108);
                    RVar6 = ref_cavity_form_edge_swap
                                      (pRVar4,ref_grid,local_a8[iVar12],local_a8[iVar1],
                                       local_a8[local_d0]);
                    if (RVar6 == 0) {
                      if (pRVar4->state == REF_CAVITY_INCONSISTENT) {
                        uVar7 = ref_cavity_free(pRVar4);
                        pRVar17 = local_110;
                        if (uVar7 != 0) {
                          pcVar14 = "free";
                          uVar10 = 0xa70;
                          goto LAB_0016429e;
                        }
                      }
                      else {
                        RVar6 = ref_cavity_check_visible(pRVar4);
                        if (RVar6 == 0) {
                          if (pRVar4->state == REF_CAVITY_VISIBLE) {
                            uVar7 = ref_cavity_ratio(pRVar4,(REF_BOOL *)&local_11c);
                            if (uVar7 != 0) {
                              pcVar14 = "post ratio limits";
                              uVar10 = 0xa79;
                              goto LAB_0016429e;
                            }
                            if (local_11c == 0) {
                              uVar7 = ref_cavity_free(pRVar4);
                              pRVar17 = local_110;
                              if (uVar7 == 0) goto LAB_00163423;
                              pcVar14 = "free";
                              uVar10 = 0xa7b;
                              goto LAB_0016429e;
                            }
                            uVar7 = ref_cavity_change(pRVar4,(REF_DBL *)&local_f8,
                                                      (REF_DBL *)&local_100);
                            if (uVar7 != 0) {
                              pcVar14 = "change";
                              uVar10 = 0xa7e;
                              goto LAB_0016429e;
                            }
                            dVar5 = (double)CONCAT44(local_100._4_4_,(int)local_100);
                            if ((0.0001 < dVar5 - (double)local_f8) && (local_b0 < dVar5)) {
                              local_f0 = (int)lVar16;
                              local_b0 = dVar5;
                            }
                          }
                          uVar7 = ref_cavity_free(pRVar4);
                          pRVar17 = local_110;
                          if (uVar7 != 0) {
                            pcVar14 = "free";
                            uVar10 = 0xa86;
                            goto LAB_0016429e;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                 ,0xa74,"ref_cavity_swap_tet_pass","check visible");
                          uVar7 = ref_cavity_free(pRVar4);
                          pRVar17 = local_110;
                          if (uVar7 != 0) {
                            pcVar14 = "free";
                            uVar10 = 0xa75;
                            goto LAB_0016429e;
                          }
                        }
                      }
                    }
                    else {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                             ,0xa6a,"ref_cavity_swap_tet_pass","form edge swap");
                      uVar7 = ref_cavity_free(pRVar4);
                      pRVar17 = local_110;
                      if (uVar7 != 0) {
                        pcVar14 = "free";
                        uVar10 = 0xa6b;
                        goto LAB_0016429e;
                      }
                    }
                  }
                }
                else {
                  uVar7 = ref_swap_same_faceid(local_118,uVar8,node1,&local_b4);
                  if (uVar7 != 0) {
                    pcVar14 = "not allowed if a side of a edge or diff faceid";
                    uVar10 = 0xa19;
                    goto LAB_00163fd2;
                  }
                  if (local_b4 != 0) {
                    uVar7 = ref_swap_manifold(local_118,uVar8,node1,&local_b8);
                    if (uVar7 != 0) {
                      pcVar14 = "not allowed if creates a triangle or edge that exists";
                      uVar10 = 0xa20;
                      goto LAB_00163fd2;
                    }
                    if (local_b8 != 0) {
                      uVar7 = ref_swap_conforming(local_118,uVar8,node1,&local_bc);
                      if (uVar7 != 0) {
                        pcVar14 = "normals and uv area must conform to geom";
                        uVar10 = 0xa27;
                        goto LAB_00163fd2;
                      }
                      if (local_bc != 0) {
                        uVar7 = ref_swap_quality(local_118,uVar8,node1,&local_c0);
                        if (uVar7 != 0) {
                          pcVar14 = "require tri quality improvement";
                          uVar10 = 0xa2e;
                          goto LAB_00163fd2;
                        }
                        if (local_c0 != 0) {
                          uVar7 = ref_swap_ratio(local_118,uVar8,node1,&local_c4);
                          if (uVar7 != 0) {
                            pcVar14 = "require tri ratio in limits";
                            uVar10 = 0xa35;
                            goto LAB_00163fd2;
                          }
                          if (local_c4 != 0) goto LAB_00163593;
                        }
                      }
                    }
                  }
                  local_11c = 0;
                  ref_grid = local_118;
                  pRVar17 = local_110;
                }
              }
            }
            else {
LAB_0016341b:
              local_11c = 0;
            }
LAB_00163423:
            lVar16 = lVar16 + 1;
            piVar15 = piVar15 + 3;
          } while (lVar16 != 0xc);
          if (local_f0 != -1) {
            uVar7 = ref_cavity_create((REF_CAVITY *)&local_108);
            if (uVar7 == 0) {
              lVar16 = (long)local_f0;
              pRVar4 = (REF_CAVITY)CONCAT44(local_108._4_4_,(int)local_108);
              uVar7 = ref_cavity_form_edge_swap
                                (pRVar4,ref_grid,local_a8[(int)(&DAT_00207ef0)[lVar16 * 3]],
                                 local_a8[(int)(&DAT_00207ef4)[lVar16 * 3]],
                                 local_a8[(int)(&DAT_00207ef8)[lVar16 * 3]]);
              if (uVar7 == 0) {
                uVar7 = ref_cavity_check_visible(pRVar4);
                if (uVar7 == 0) {
                  if (pRVar4->debug != 0) {
                    uVar7 = ref_cavity_change(pRVar4,(REF_DBL *)&local_f8,(REF_DBL *)&local_100);
                    if (uVar7 != 0) {
                      pcVar14 = "change";
                      uVar10 = 0xa92;
                      goto LAB_0016429e;
                    }
                    printf("cavity accepted %f -> %f\n",local_f8,
                           CONCAT44(local_100._4_4_,(int)local_100));
                  }
                  uVar7 = ref_cavity_replace(pRVar4);
                  if (uVar7 == 0) {
                    uVar7 = ref_cavity_free(pRVar4);
                    pRVar17 = local_110;
                    if (uVar7 == 0) goto LAB_0016386e;
                    pcVar14 = "free";
                    uVar10 = 0xa96;
                  }
                  else {
                    pcVar14 = "replace";
                    uVar10 = 0xa95;
                  }
                }
                else {
                  pcVar14 = "enlarge viz";
                  uVar10 = 0xa90;
                }
              }
              else {
                pcVar14 = "cavity gem";
                uVar10 = 0xa8f;
              }
            }
            else {
              pcVar14 = "create";
              uVar10 = 0xa89;
            }
LAB_0016429e:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,uVar10,"ref_cavity_swap_tet_pass",(ulong)uVar7,pcVar14);
            pcVar14 = "cavity swap pass";
            uVar10 = 0xb00;
            goto LAB_001642c6;
          }
        }
      }
LAB_0016386e:
      RVar13 = (int)local_d8 + 1;
    } while (RVar13 < pRVar17->max);
    local_e8 = ref_grid->node;
  }
  if (ref_grid->surf != 0) {
    pRVar17 = ref_grid->cell[0];
    ref_cell = ref_grid->cell[3];
    local_d8 = ref_cell;
    if (0 < pRVar17->max) {
      RVar13 = 0;
      do {
        RVar6 = ref_cell_nodes(pRVar17,RVar13,(REF_INT *)local_a8);
        uVar7 = local_a8[1];
        if (RVar6 == 0) {
          local_d0 = CONCAT44(local_d0._4_4_,local_a8[0]);
          lVar16 = (long)(int)local_a8[0];
          if (local_e8->ref_mpi->id == local_e8->part[lVar16]) {
            uVar8 = ref_cell_list_with2(local_d8,local_a8[0],local_a8[1],2,(REF_INT *)&local_108,
                                        (REF_INT *)&local_e0);
            if (uVar8 != 0) {
              lVar9 = (long)(int)uVar7;
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0xac5,"ref_cavity_surf_geom_edge_pass",(ulong)uVar8,"tris");
              pRVar11 = local_118;
              pRVar3 = local_118->node->real;
              printf(" %.16e %.16e %.16e\n",pRVar3[lVar16 * 0xf],pRVar3[lVar16 * 0xf + 1],
                     pRVar3[lVar16 * 0xf + 2]);
              pRVar3 = pRVar11->node->real;
              printf(" %.16e %.16e %.16e\n",pRVar3[lVar9 * 0xf],pRVar3[lVar9 * 0xf + 1],
                     pRVar3[lVar9 * 0xf + 2]);
              ref_export_tec_surf(pRVar11,"ref_cavity_geom_edge_fail.tec");
LAB_0016405a:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0xb01,"ref_cavity_pass",(ulong)uVar8,"cavity geom edge");
              return uVar8;
            }
            if (0 < (int)local_108) {
              lVar16 = 0;
              do {
                cell = *(REF_INT *)((long)&local_e0 + lVar16 * 4);
                uVar8 = ref_cell_nodes(local_d8,cell,(REF_INT *)local_a8);
                if (uVar8 != 0) {
                  pcVar14 = "cell nodes";
                  uVar10 = 0xac8;
LAB_0016404e:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,uVar10,"ref_cavity_surf_geom_edge_pass",(ulong)uVar8,pcVar14);
                  goto LAB_0016405a;
                }
                uVar8 = ref_geom_tri_norm_deviation
                                  (local_118,(REF_INT *)local_a8,(REF_DBL *)&local_f8);
                if (uVar8 != 0) {
                  pcVar14 = "nd";
                  uVar10 = 0xac9;
                  goto LAB_0016404e;
                }
                if ((double)local_f8 < 0.5) {
                  uVar8 = ref_cavity_create((REF_CAVITY *)&local_100);
                  if (uVar8 == 0) {
                    pRVar4 = (REF_CAVITY)CONCAT44(local_100._4_4_,(int)local_100);
                    pRVar4->ref_grid = local_118;
                    pRVar4->node = (REF_INT)local_d0;
                    uVar8 = ref_cavity_add_tri(pRVar4,cell);
                    if (uVar8 == 0) {
                      uVar8 = ref_cavity_enlarge_conforming(pRVar4);
                      if (uVar8 == 0) {
                        if (pRVar4->state == REF_CAVITY_VISIBLE) {
                          uVar8 = ref_cavity_normdev(pRVar4,&local_ec);
                          if (uVar8 == 0) {
                            if ((local_ec == 0) || (uVar8 = ref_cavity_replace(pRVar4), uVar8 == 0))
                            goto LAB_00163a01;
                            pcVar14 = "replace tri";
                            uVar10 = 0xad2;
                          }
                          else {
                            pcVar14 = "normdev tri";
                            uVar10 = 0xad0;
                          }
                        }
                        else {
LAB_00163a01:
                          uVar8 = ref_cavity_free(pRVar4);
                          if (uVar8 == 0) goto LAB_00163a14;
                          pcVar14 = "free";
                          uVar10 = 0xad5;
                        }
                      }
                      else {
                        pcVar14 = "enlarge tri";
                        uVar10 = 0xace;
                      }
                    }
                    else {
                      pcVar14 = "insert tri";
                      uVar10 = 0xacd;
                    }
                  }
                  else {
                    pcVar14 = "create";
                    uVar10 = 0xacb;
                  }
                  goto LAB_0016404e;
                }
LAB_00163a14:
                lVar16 = lVar16 + 1;
              } while (lVar16 < (int)local_108);
            }
          }
        }
        RVar13 = RVar13 + 1;
      } while (RVar13 < pRVar17->max);
      if (local_118->surf == 0) {
        return 0;
      }
      local_e8 = local_118->node;
      ref_cell = local_118->cell[3];
    }
    if (0 < ref_cell->max) {
      iVar12 = 0;
      pRVar11 = local_118;
      do {
        RVar6 = ref_cell_nodes(ref_cell,iVar12,(REF_INT *)local_a8);
        if ((RVar6 == 0) && (local_e8->ref_mpi->id == local_e8->part[(int)local_a8[0]])) {
          uVar7 = ref_geom_is_a(pRVar11->geom,local_a8[0],1,(REF_BOOL *)&local_108);
          if (uVar7 != 0) {
            pcVar14 = "n";
            uVar10 = 0xaea;
            goto LAB_00164200;
          }
          if ((int)local_108 == 0) {
            uVar7 = ref_geom_tri_norm_deviation(pRVar11,(REF_INT *)local_a8,&local_e0);
            if (uVar7 != 0) {
              pcVar14 = "nd";
              uVar10 = 0xaee;
              goto LAB_00164200;
            }
            if (local_e0 < 0.1) {
              uVar7 = ref_cavity_create(&local_f8);
              pRVar4 = local_f8;
              if (uVar7 != 0) {
                pcVar14 = "create";
                uVar10 = 0xaf0;
LAB_00164200:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,uVar10,"ref_cavity_surf_geom_face_pass",(ulong)uVar7,pcVar14);
                pcVar14 = "cavity geom edge";
                uVar10 = 0xb02;
LAB_001642c6:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,uVar10,"ref_cavity_pass",(ulong)uVar7,pcVar14);
                return uVar7;
              }
              uVar7 = ref_cavity_form_ball(local_f8,pRVar11,local_a8[0]);
              if (uVar7 != 0) {
                pcVar14 = "insert ball";
                uVar10 = 0xaf1;
                goto LAB_00164200;
              }
              uVar7 = ref_cavity_enlarge_conforming(pRVar4);
              if (uVar7 != 0) {
                pcVar14 = "enlarge tri";
                uVar10 = 0xaf2;
                goto LAB_00164200;
              }
              if (pRVar4->state == REF_CAVITY_VISIBLE) {
                uVar7 = ref_cavity_normdev(pRVar4,(REF_BOOL *)&local_100);
                if (uVar7 != 0) {
                  pcVar14 = "normdev tri";
                  uVar10 = 0xaf4;
                  goto LAB_00164200;
                }
                if (((int)local_100 != 0) && (uVar7 = ref_cavity_replace(pRVar4), uVar7 != 0)) {
                  pcVar14 = "replace tri";
                  uVar10 = 0xaf6;
                  goto LAB_00164200;
                }
              }
              uVar7 = ref_cavity_free(pRVar4);
              pRVar11 = local_118;
              if (uVar7 != 0) {
                pcVar14 = "free";
                uVar10 = 0xaf9;
                goto LAB_00164200;
              }
            }
          }
        }
        iVar12 = iVar12 + 1;
      } while (iVar12 < ref_cell->max);
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_pass(REF_GRID ref_grid) {
  RSS(ref_cavity_swap_tet_pass(ref_grid), "cavity swap pass");
  RSS(ref_cavity_surf_geom_edge_pass(ref_grid), "cavity geom edge");
  RSS(ref_cavity_surf_geom_face_pass(ref_grid), "cavity geom edge");
  return REF_SUCCESS;
}